

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_consume_link_reference_definitions(MD_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  void *__dest;
  long in_RDI;
  int n_link_ref_lines;
  MD_SIZE n;
  MD_SIZE n_lines;
  MD_LINE *lines;
  MD_LINE *in_stack_00000020;
  MD_CTX *in_stack_00000028;
  uint local_20;
  
  __dest = (void *)(*(long *)(in_RDI + 0x210) + 8);
  uVar1 = *(uint *)(*(long *)(in_RDI + 0x210) + 4);
  local_20 = 0;
  while ((local_20 < uVar1 &&
         (iVar2 = md_is_link_reference_definition(in_stack_00000028,in_stack_00000020,ctx._4_4_),
         iVar2 != 0))) {
    if (iVar2 < 0) {
      return -1;
    }
    local_20 = iVar2 + local_20;
  }
  if (local_20 != 0) {
    if (local_20 == uVar1) {
      *(uint *)(in_RDI + 0x218) = *(int *)(in_RDI + 0x218) + local_20 * -8;
      *(int *)(in_RDI + 0x218) = *(int *)(in_RDI + 0x218) + -8;
      *(undefined8 *)(in_RDI + 0x210) = 0;
    }
    else {
      memmove(__dest,(void *)((long)__dest + (ulong)local_20 * 8),(ulong)(uVar1 - local_20) << 3);
      *(uint *)(*(long *)(in_RDI + 0x210) + 4) = *(int *)(*(long *)(in_RDI + 0x210) + 4) - local_20;
      *(uint *)(in_RDI + 0x218) = *(int *)(in_RDI + 0x218) + local_20 * -8;
    }
  }
  return 0;
}

Assistant:

static int
md_consume_link_reference_definitions(MD_CTX* ctx)
{
    MD_LINE* lines = (MD_LINE*) (ctx->current_block + 1);
    MD_SIZE n_lines = ctx->current_block->n_lines;
    MD_SIZE n = 0;

    /* Compute how many lines at the start of the block form one or more
     * reference definitions. */
    while(n < n_lines) {
        int n_link_ref_lines;

        n_link_ref_lines = md_is_link_reference_definition(ctx,
                                    lines + n, n_lines - n);
        /* Not a reference definition? */
        if(n_link_ref_lines == 0)
            break;

        /* We fail if it is the ref. def. but it could not be stored due
         * a memory allocation error. */
        if(n_link_ref_lines < 0)
            return -1;

        n += n_link_ref_lines;
    }

    /* If there was at least one reference definition, we need to remove
     * its lines from the block, or perhaps even the whole block. */
    if(n > 0) {
        if(n == n_lines) {
            /* Remove complete block. */
            ctx->n_block_bytes -= n * sizeof(MD_LINE);
            ctx->n_block_bytes -= sizeof(MD_BLOCK);
            ctx->current_block = NULL;
        } else {
            /* Remove just some initial lines from the block. */
            memmove(lines, lines + n, (n_lines - n) * sizeof(MD_LINE));
            ctx->current_block->n_lines -= n;
            ctx->n_block_bytes -= n * sizeof(MD_LINE);
        }
    }

    return 0;
}